

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O1

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  int iVar1;
  undefined8 uVar2;
  WritableFile *pWVar3;
  uint uVar4;
  size_t *in_RDX;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  size_t length;
  long in_FS_OFFSET;
  undefined1 local_50 [16];
  void *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  length = *in_RDX;
  uVar8 = in_RDX[1];
  this->dest_ = (WritableFile *)0x0;
  bVar7 = true;
  pWVar3 = (WritableFile *)local_50._0_8_;
  do {
    local_50._0_8_ = pWVar3;
    iVar1 = (int)slice->size_;
    if (0x8000 < iVar1) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("leftover >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,0x2d,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar1) {
      if (iVar1 != 0x8000) {
        local_50._8_8_ = ZEXT48(0x8000 - iVar1);
        local_50._0_8_ = "";
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_40,slice->data_,local_50);
        if (local_40 != (void *)0x0) {
          operator_delete__(local_40);
        }
      }
      *(undefined4 *)&slice->size_ = 0;
    }
    uVar4 = 0x7ff9 - (int)slice->size_;
    if ((int)uVar4 < 0) {
      this->dest_ = (WritableFile *)0x0;
      __assert_fail("kBlockSize - block_offset_ - kHeaderSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,0x39,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    uVar5 = (ulong)uVar4;
    uVar6 = uVar5;
    if (uVar8 < uVar5) {
      uVar6 = uVar8;
    }
    uVar4 = (uVar5 < uVar8) + 1;
    if (!bVar7) {
      uVar4 = 4 - (uVar5 < uVar8);
    }
    EmitPhysicalRecord((Writer *)local_50,(RecordType)slice,(char *)(ulong)uVar4,length);
    uVar2 = local_50._0_8_;
    local_50._0_8_ = (WritableFile *)0x0;
    if ((WritableFile *)uVar2 != (WritableFile *)0x0) break;
    length = length + uVar6;
    bVar7 = false;
    uVar8 = uVar8 - uVar6;
    pWVar3 = (WritableFile *)0x0;
  } while (uVar8 != 0);
  this->dest_ = (WritableFile *)uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}